

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ShellANCF_Force::Evaluate
          (ShellANCF_Force *this,ChVectorN<double,_54> *result,double x,double y,double z)

{
  double dVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [32];
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  ChVectorN<double,_54> *vector;
  Scalar *pSVar46;
  Scalar *pSVar47;
  Scalar *pSVar48;
  Scalar *pSVar49;
  Scalar *pSVar50;
  Scalar *pSVar51;
  int j_2;
  double *pdVar52;
  ChElementShellANCF_3423 *pCVar53;
  int j;
  long lVar54;
  ulong uVar55;
  int i_3;
  long lVar56;
  int i;
  long lVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined8 in_XMM0_Qb;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  CoeffReturnType CVar76;
  CoeffReturnType CVar77;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined8 in_XMM1_Qb;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  double dVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  double detJ0;
  ChVectorN<double,_6> DEPS;
  ChVectorN<double,_6> strain;
  ShapeVector Ny;
  ChMatrixNM<double,_1,_3> tempB3;
  ShapeVector Nx;
  ChMatrixNM<double,_1,_3> tempB31;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_24> tempB;
  ChVectorN<double,_5> HE;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> ddNy;
  ShapeVector N;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChMatrixNM<double,_5,_6> temp56;
  ChVectorN<double,_8> ddNx;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChVectorN<double,_8> d0d0Nx;
  ShapeVector Nz;
  ChMatrixNM<double,_5,_5> KALPHA;
  ChMatrixNM<double,_3,_3> j0;
  ChMatrixNM<double,_6,_5> G;
  ChVectorN<double,_24> Fint;
  ChMatrixNM<double,_6,_5> M;
  double local_1358;
  ulong local_1350;
  ulong local_1348;
  ulong local_1340;
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  ChVectorN<double,_54> *local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  undefined1 local_12e0 [16];
  ulong uStack_12d0;
  double dStack_12c8;
  undefined8 local_12c0;
  undefined8 local_12b8;
  undefined8 local_12b0;
  undefined8 local_12a8;
  undefined8 local_12a0;
  undefined8 local_1298;
  undefined1 local_1290 [16];
  undefined1 local_1280 [128];
  undefined1 local_1200 [88];
  VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1> local_11a8;
  Matrix<double,_1,_3,_1,_1,_3> local_1170;
  ChMatrixNM<double,_1,_3> local_1158;
  Matrix<double,_1,_24,_1,_1,_24> local_1140;
  Matrix<double,_5,_1,_0,_5,_1> local_1068;
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  ShapeVector local_fc0;
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> local_f80 [48];
  undefined1 local_f50 [16];
  double local_f40;
  ChMatrixNM<double,_1,_3> local_f30;
  ChMatrixNM<double,_1,_3> local_f10;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>_>
  local_ef0 [5];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [1152];
  Matrix<double,_6,_24,_1,_6,_24> local_940;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_4c0 [64];
  ShapeVector local_480;
  undefined1 local_440 [200];
  undefined1 local_378 [16];
  ulong uStack_368;
  ulong uStack_360;
  undefined1 local_358 [16];
  ulong local_348;
  undefined1 local_340 [16];
  Matrix<double,_5,_6,_1,_5,_6> local_330;
  Matrix<double,_24,_1,_0,_24,_1> local_240;
  ChMatrixNM<double,_6,_5> local_170;
  undefined1 auVar165 [32];
  undefined1 auVar222 [32];
  undefined1 auVar226 [32];
  
  pCVar53 = this->m_element;
  local_1320 = result;
  ChElementShellANCF_3423::ShapeFunctions(pCVar53,&local_fc0,x,y,z);
  local_1358 = ChElementShellANCF_3423::Calc_detJ0
                         (pCVar53,x,y,z,(ShapeVector *)local_1200,(ShapeVector *)local_1280,
                          &local_480,&local_f10,&local_f30,&local_1158);
  auVar65._8_8_ = in_XMM1_Qb;
  auVar65._0_8_ = y;
  auVar62._8_8_ = in_XMM0_Qb;
  auVar62._0_8_ = x;
  auVar59 = vunpcklpd_avx(auVar62,auVar65);
  auVar231 = vpermpd_avx2(ZEXT1632(auVar59),0x50);
  auVar179._16_16_ = _DAT_00ef8bf0;
  auVar179._0_16_ = _DAT_00ef8bf0;
  auVar42._8_8_ = 0x3fe0000000000000;
  auVar42._0_8_ = 0x3fe0000000000000;
  auVar42._16_8_ = 0x3fe0000000000000;
  auVar42._24_8_ = 0x3fe0000000000000;
  _local_12e0 = vfmadd213pd_avx512vl(auVar179,auVar231,auVar42);
  ChElementShellANCF_3423::Basis_M(pCVar53,&local_170,x,y,z);
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  auVar190._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar190._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  auVar205._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar205._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar45._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar45._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar69._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar69._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar59 = vunpcklpd_avx(auVar190,auVar125);
  auVar60 = vunpcklpd_avx(auVar205,auVar78);
  auVar199._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1] * auVar59._0_8_;
  auVar199._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2] * auVar59._8_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0] * local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
             .array[1];
  auVar59 = vfmsub231sd_fma(auVar79,auVar125,auVar69);
  local_f50 = vfmsub213pd_fma(auVar60,auVar45,auVar199);
  local_f40 = auVar59._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1] * local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
             .array[1];
  auVar59 = vfmadd231sd_fma(auVar80,auVar125,auVar125);
  auVar59 = vfmadd231sd_fma(auVar59,auVar190,auVar190);
  auVar59 = vsqrtsd_avx(auVar59,auVar59);
  dVar71 = 1.0 / auVar59._0_8_;
  dVar43 = local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[0] * dVar71;
  dVar44 = local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[1] * dVar71;
  dVar71 = local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[2] * dVar71;
  ChVector<double>::GetNormalized((ChVector<double> *)&local_940,(ChVector<double> *)local_f50);
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[2];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar44;
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[1];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar71;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar43;
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[0];
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       dVar44 * local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
                m_data.array[2];
  auVar64 = vfmsub231sd_fma(auVar200,auVar166,auVar182);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       dVar43 * local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
                m_data.array[1];
  auVar67 = vfmsub231sd_fma(auVar167,auVar81,auVar191);
  dVar1 = (this->m_element->m_layers).
          super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
          ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_theta;
  auVar183._8_8_ = 0;
  auVar183._0_8_ =
       dVar71 * local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.
                m_data.array[0];
  auVar60 = vfmsub231sd_fma(auVar183,auVar126,auVar206);
  dVar72 = cos(dVar1);
  dVar73 = sin(dVar1);
  dVar41 = dVar73 * auVar60._0_8_ + dVar72 * dVar44;
  dVar74 = sin(dVar1);
  dVar75 = cos(dVar1);
  auVar70._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar70._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  auVar225._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar225._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar226._16_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar226._0_16_ = auVar225;
  auVar226._24_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar223._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar223._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar211._8_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar211._0_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar231._8_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar231._0_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar231._16_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar231._24_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar59 = vunpcklpd_avx(auVar223,auVar225);
  auVar231 = vblendpd_avx(ZEXT1632(auVar59),auVar231,0xc);
  dVar1 = dVar75 * auVar60._0_8_ - dVar74 * dVar44;
  dVar44 = dVar75 * auVar67._0_8_ - dVar74 * dVar71;
  auVar127._8_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar127._0_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar165._16_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar165._0_16_ = auVar127;
  auVar165._24_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar66._8_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar66._0_8_ =
       local_1158.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar60 = vunpcklpd_avx(auVar127,auVar70);
  auVar61 = vunpcklpd_avx(auVar211,auVar127);
  auVar59 = vunpcklpd_avx(auVar127,auVar66);
  auVar42 = vblendpd_avx(ZEXT1632(auVar66),auVar165,4);
  auVar68._8_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar68._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  auVar179 = vpermpd_avx2(auVar42,0x24);
  auVar124._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar124._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar124._16_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar124._24_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  auVar221._16_16_ = auVar68;
  auVar221._0_16_ = auVar59;
  auVar180._16_16_ = auVar70;
  auVar180._0_16_ = auVar59;
  auVar42 = vblendpd_avx(ZEXT1632(auVar68),auVar226,4);
  auVar165 = vblendpd_avx(auVar221,auVar180,10);
  auVar42 = vblendpd_avx(auVar42,auVar124,8);
  auVar201._0_8_ =
       -local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2];
  auVar201._8_8_ =
       -local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2];
  auVar218._0_8_ = -auVar165._0_8_;
  auVar218._8_8_ = -auVar165._8_8_;
  auVar222._16_8_ = -auVar165._16_8_;
  auVar222._0_16_ = auVar218;
  auVar222._24_8_ = -auVar165._24_8_;
  auVar181._0_8_ = auVar231._0_8_ * auVar165._0_8_;
  auVar181._8_8_ = auVar231._8_8_ * auVar165._8_8_;
  auVar181._16_8_ = auVar231._16_8_ * auVar165._16_8_;
  auVar181._24_8_ = auVar231._24_8_ * auVar165._24_8_;
  auVar192._0_8_ =
       -local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[0];
  auVar192._8_8_ =
       -local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[1];
  auVar59 = vfmsub231pd_fma(auVar181,auVar179,auVar42);
  auVar63 = vunpcklpd_avx(auVar192,auVar222._16_16_);
  _local_378 = vpermpd_avx2(ZEXT1632(auVar59),0xc9);
  auVar59 = vblendpd_avx(auVar201,auVar218,2);
  auVar168._0_8_ = auVar60._0_8_ * auVar59._0_8_;
  auVar168._8_8_ = auVar60._8_8_ * auVar59._8_8_;
  local_358 = vfmadd231pd_fma(auVar168,auVar70,auVar61);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1] * local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
             .array[2];
  auVar59 = vfmsub231sd_fma(auVar169,auVar225,auVar59);
  auVar82._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  auVar82._0_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  local_348 = auVar59._0_8_;
  auVar170._0_8_ =
       local_f30.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2] * auVar63._0_8_;
  auVar170._8_8_ =
       local_f10.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1] * auVar63._8_8_;
  local_340 = vfmadd213pd_fma(auVar82,auVar68,auVar170);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_378,&local_1358);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_378._8_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = local_378._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = dVar73 * auVar64._0_8_ + dVar72 * dVar43;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uStack_368;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar73 * auVar67._0_8_ + dVar72 * dVar71;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar75 * auVar64._0_8_ - dVar74 * dVar43;
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[0];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = local_358._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uStack_360;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = local_358._8_8_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = local_340._0_8_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_348;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = local_340._8_8_;
  local_dc0._0_8_ =
       &(this->m_element->m_layers).
        super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
        ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_T0;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar41 * (double)local_378._8_8_;
  auVar59 = vfmadd231sd_fma(auVar219,auVar227,auVar171);
  auVar59 = vfmadd231sd_fma(auVar59,auVar229,auVar207);
  dVar75 = auVar59._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar1;
  auVar59 = vmulsd_avx512f(auVar239,auVar184);
  auVar59 = vfmadd231sd_fma(auVar59,auVar233,auVar171);
  auVar185._8_8_ = 0;
  auVar185._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[1] * (double)local_378._8_8_;
  auVar60 = vfmadd231sd_fma(auVar185,auVar224,auVar171);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar44;
  auVar59 = vfmadd231sd_avx512f(auVar59,auVar234,auVar207);
  dVar217 = auVar59._0_8_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[2];
  auVar59 = vfmadd231sd_fma(auVar60,auVar220,auVar207);
  auVar60 = vmulsd_avx512f(auVar239,auVar193);
  auVar60 = vfmadd231sd_fma(auVar60,auVar233,auVar83);
  dVar71 = auVar59._0_8_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar41 * (double)local_358._0_8_;
  auVar59 = vfmadd231sd_fma(auVar186,auVar227,auVar83);
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar234,auVar209);
  auVar59 = vfmadd231sd_fma(auVar59,auVar229,auVar209);
  dVar74 = auVar60._0_8_;
  dVar72 = auVar59._0_8_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[1] * (double)local_358._0_8_;
  auVar59 = vfmadd231sd_fma(auVar187,auVar224,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar41 * (double)local_340._0_8_;
  auVar60 = vfmadd231sd_fma(auVar84,auVar128,auVar227);
  auVar59 = vfmadd231sd_fma(auVar59,auVar220,auVar209);
  auVar60 = vfmadd231sd_fma(auVar60,auVar212,auVar229);
  dVar73 = auVar59._0_8_;
  auVar91._0_8_ = auVar60._0_8_;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar1;
  auVar59 = vmulsd_avx512f(auVar240,auVar202);
  auVar59 = vfmadd231sd_fma(auVar59,auVar128,auVar233);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar44;
  auVar59 = vfmadd231sd_avx512f(auVar59,auVar212,auVar235);
  auVar96._0_8_ = auVar59._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
       array[1] * (double)local_340._0_8_;
  auVar59 = vfmadd231sd_fma(auVar85,auVar224,auVar128);
  auVar59 = vfmadd231sd_fma(auVar59,auVar220,auVar212);
  auVar106._0_8_ = auVar59._0_8_;
  local_dc0._8_8_ = &local_170;
  local_ef0[0].m_lhs.m_lhs.m_lhs.m_matrix =
       (non_const_type)(*(double *)(local_dc0._0_8_ + -0x120 + 0x108) / local_1358);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>
             *)&local_940,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>
             *)local_dc0,(double *)local_ef0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,5,1,6,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,5,1,6,5>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,5,0,6,5>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,6,5,1,6,5>> *)&local_330,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)this->m_alpha_eas;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)&local_330;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,5,1,6,5>,Eigen::Matrix<double,5,1,0,5,1>,0>>
            (local_f80,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_5,_1,_6,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)&this->m_element->m_ddT;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1200;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_e00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)&this->m_element->m_ddT;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_1000,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)&this->m_element->m_d0d0T;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1200;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (local_4c0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)&this->m_element->m_d0d0T;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1280;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> *)local_1040,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_8,_8,_1,_8,_8>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_e00;
  lVar56 = 0;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)local_1200;
  CVar76 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_940,0,0);
  local_dc0._0_8_ = (LhsNested)local_1200;
  local_dc0._8_8_ = local_4c0;
  CVar77 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_dc0,0,0);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)local_1280;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1000;
  dVar1 = (CVar76 - CVar77) * 0.5;
  CVar76 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_940,0,0);
  local_dc0._0_8_ = local_1280;
  local_dc0._8_8_ = local_1040;
  CVar77 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_dc0,0,0);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)local_1200;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)local_1000;
  dVar41 = (CVar76 - CVar77) * 0.5;
  CVar76 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)&local_940,0,0);
  local_dc0._8_8_ = local_1040;
  local_dc0._0_8_ = (LhsNested)local_1200;
  CVar77 = Eigen::
           DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
           ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_0>
                    *)local_dc0,0,0);
  pCVar53 = this->m_element;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar41;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar1;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = local_12e0._0_8_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = dVar74;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar217;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar71;
  auVar188._8_8_ = 0;
  auVar188._0_8_ =
       local_fc0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [6];
  dVar43 = CVar76 - CVar77;
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       local_fc0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [0];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar72;
  auVar61 = vmulsd_avx512f(auVar244,auVar210);
  auVar62 = vaddsd_avx512f(auVar210,auVar210);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar75;
  auVar63 = vmulsd_avx512f(auVar236,auVar232);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = auVar96._0_8_;
  auVar64 = vmulsd_avx512f(auVar236,auVar241);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[0];
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       local_fc0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [2] * (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.
             m_storage.m_data.array[1];
  auVar59 = vfmadd231sd_fma(auVar172,auVar129,auVar60);
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       local_fc0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array
       [4];
  auVar60 = vmulsd_avx512f(auVar244,auVar61);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar72;
  auVar65 = vfmadd231sd_avx512f(auVar63,auVar228,auVar245);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = auVar91._0_8_;
  auVar66 = vfmadd231sd_avx512f(auVar64,auVar228,auVar247);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[2];
  auVar59 = vfmadd132sd_fma(auVar130,auVar59,auVar61);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uStack_12d0;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[3];
  auVar59 = vfmadd132sd_fma(auVar188,auVar59,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[6];
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       dStack_12c8 *
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[7];
  auVar61 = vfmadd231sd_fma(auVar131,auVar173,auVar64);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[4];
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       (double)local_12e0._8_8_ *
       (pCVar53->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[5];
  auVar63 = vfmadd231sd_fma(auVar174,auVar194,auVar67);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar75;
  auVar64 = vmulsd_avx512f(auVar237,auVar208);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[1]
       = (double)&pCVar53->m_d;
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar237,auVar64);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar43;
  auVar64 = vmulsd_avx512f(auVar237,auVar86);
  auVar67 = vaddsd_avx512f(auVar59,auVar59);
  auVar68 = vmulsd_avx512f(auVar247,auVar67);
  auVar60 = vfmadd213sd_avx512f(auVar64,auVar245,auVar60);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = auVar91._0_8_;
  auVar64 = vmulsd_avx512f(auVar248,auVar59);
  auVar60 = vfmadd213sd_avx512f(auVar64,auVar248,auVar60);
  auVar64 = vmulsd_avx512f(auVar237,auVar61);
  auVar60 = vfmadd213sd_avx512f(auVar64,auVar248,auVar60);
  auVar64 = vmulsd_avx512f(auVar245,auVar63);
  auVar60 = vfmadd213sd_avx512f(auVar64,auVar248,auVar60);
  local_12c0 = auVar60._0_8_;
  auVar64 = vmulsd_avx512f(auVar245,auVar62);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar217 * dVar1;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar74 * dVar74 * dVar41;
  auVar60 = vfmadd231sd_fma(auVar203,auVar228,auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar217 * dVar43;
  auVar60 = vfmadd213sd_fma(auVar196,auVar232,auVar60);
  auVar69 = vmulsd_avx512f(auVar241,auVar59);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = auVar96._0_8_;
  auVar60 = vfmadd213sd_avx512f(auVar69,auVar242,auVar60);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar217 * auVar61._0_8_;
  auVar60 = vfmadd213sd_avx512f(auVar197,auVar242,auVar60);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar74 * auVar63._0_8_;
  auVar60 = vfmadd213sd_avx512f(auVar204,auVar242,auVar60);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar1 + dVar1;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar75;
  auVar69 = vmulsd_avx512f(auVar238,auVar198);
  local_12b8 = auVar60._0_8_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = dVar74 * auVar64._0_8_;
  auVar60 = vfmadd231sd_fma(auVar213,auVar69,auVar228);
  auVar60 = vfmadd231sd_fma(auVar60,auVar86,auVar65);
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar68,auVar242);
  auVar60 = vfmadd231sd_fma(auVar60,auVar61,auVar66);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = auVar96._0_8_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar72;
  auVar70 = vmulsd_avx512f(auVar246,auVar243);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = auVar91._0_8_;
  auVar70 = vfmadd231sd_avx512f(auVar70,auVar232,auVar249);
  auVar60 = vfmadd231sd_fma(auVar60,auVar63,auVar70);
  local_12e8 = auVar70._0_8_;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar73;
  auVar70 = vmulsd_avx512f(auVar253,auVar210);
  auVar70 = vmulsd_avx512f(auVar253,auVar70);
  local_12b0 = auVar60._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = dVar71 * dVar1;
  auVar60 = vfmadd231sd_fma(auVar70,auVar230,auVar214);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = auVar106._0_8_;
  auVar59 = vmulsd_avx512f(auVar250,auVar59);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar71 * dVar43;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar73;
  auVar60 = vfmadd213sd_avx512f(auVar215,auVar254,auVar60);
  auVar59 = vfmadd213sd_avx512f(auVar59,auVar250,auVar60);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar71 * auVar61._0_8_;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = auVar106._0_8_;
  auVar59 = vfmadd213sd_avx512f(auVar216,auVar251,auVar59);
  auVar60 = vmulsd_avx512f(auVar254,auVar63);
  auVar59 = vfmadd213sd_avx512f(auVar60,auVar251,auVar59);
  local_12a8 = auVar59._0_8_;
  auVar59 = vmulsd_avx512f(auVar254,auVar64);
  auVar60 = vmulsd_avx512f(auVar246,auVar251);
  auVar59 = vfmadd231sd_fma(auVar59,auVar230,auVar69);
  auVar64 = vmulsd_avx512f(auVar238,auVar254);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar73;
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar255,auVar249);
  auVar64 = vfmadd231sd_avx512f(auVar64,auVar230,auVar246);
  local_1300 = auVar60._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar43;
  auVar59 = vfmadd231sd_fma(auVar59,auVar87,auVar64);
  local_12f0 = auVar64._0_8_;
  auVar64 = vmulsd_avx512f(auVar238,auVar251);
  auVar64 = vfmadd231sd_avx512f(auVar64,auVar230,auVar249);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = auVar106._0_8_;
  auVar59 = vfmadd231sd_avx512f(auVar59,auVar252,auVar68);
  local_12f8 = auVar64._0_8_;
  auVar59 = vfmadd231sd_fma(auVar59,auVar61,auVar64);
  auVar59 = vfmadd231sd_fma(auVar59,auVar63,auVar60);
  local_12a0 = auVar59._0_8_;
  auVar59 = vmulsd_avx512f(auVar232,auVar62);
  auVar59 = vmulsd_avx512f(auVar255,auVar59);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar217 * (dVar1 + dVar1);
  auVar59 = vfmadd231sd_fma(auVar59,auVar230,auVar189);
  auVar60 = vmulsd_avx512f(auVar228,auVar255);
  auVar60 = vfmadd231sd_fma(auVar60,auVar230,auVar232);
  auVar59 = vfmadd231sd_fma(auVar59,auVar60,auVar87);
  auVar64 = vmulsd_avx512f(auVar243,auVar67);
  local_1308 = auVar60._0_8_;
  auVar60 = vmulsd_avx512f(auVar228,auVar252);
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar230,auVar243);
  auVar59 = vfmadd213sd_avx512f(auVar64,auVar252,auVar59);
  local_1310 = auVar60._0_8_;
  auVar59 = vfmadd231sd_fma(auVar59,auVar60,auVar61);
  auVar60 = vmulsd_avx512f(auVar232,auVar252);
  auVar60 = vfmadd231sd_avx512f(auVar60,auVar255,auVar243);
  auVar59 = vfmadd231sd_fma(auVar59,auVar60,auVar63);
  local_1318 = auVar60._0_8_;
  local_1298 = auVar59._0_8_;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array[0]
       = (double)local_1200;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((Matrix<double,_1,_3,_1,_1,_3> *)(local_1280 + 0x68),
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)&local_940);
  for (lVar57 = 0; lVar57 != 8; lVar57 = lVar57 + 1) {
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                           (local_1280 + 0x68),0,lVar54);
      dVar1 = *pSVar46;
      pSVar47 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_1200,0,
                           lVar57);
      dVar41 = *pSVar47;
      pSVar48 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_1140
                           ,0,lVar56 + lVar54);
      *pSVar48 = dVar1 * dVar41;
    }
    lVar56 = lVar56 + 3;
  }
  lVar56 = 0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  local_dc0._8_8_ = &this->m_element->m_d;
  local_dc0._0_8_ = local_1280;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((Matrix<double,_1,_3,_1,_1,_3> *)(local_1280 + 0x68),
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)local_dc0);
  for (lVar57 = 0; lVar57 != 8; lVar57 = lVar57 + 1) {
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                           (local_1280 + 0x68),0,lVar54);
      dVar1 = *pSVar46;
      pSVar47 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_1280,0,
                           lVar57);
      dVar41 = *pSVar47;
      pSVar48 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_1140
                           ,0,lVar56 + lVar54);
      *pSVar48 = dVar1 * dVar41;
    }
    lVar56 = lVar56 + 3;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  local_dc0._8_8_ = &this->m_element->m_d;
  local_dc0._0_8_ = local_1200;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Product<Eigen::Matrix<double,1,8,1,1,8>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            (&local_1170,
             (Product<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>
              *)local_dc0);
  lVar57 = 0;
  for (lVar56 = 0; lVar56 != 8; lVar56 = lVar56 + 1) {
    for (lVar54 = 0; lVar54 != 3; lVar54 = lVar54 + 1) {
      pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                           (local_1280 + 0x68),0,lVar54);
      SVar2 = *pSVar46;
      pSVar47 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_1200,0,
                           lVar56);
      SVar3 = *pSVar47;
      pSVar46 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&local_1170,0
                           ,lVar54);
      dVar1 = *pSVar46;
      pSVar47 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)local_1280,0,
                           lVar56);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = SVar3;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = SVar2;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = dVar1 * *pSVar47;
      auVar59 = vfmadd231sd_fma(auVar132,auVar88,auVar5);
      pSVar48 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>,_1> *)&local_1140
                           ,0,lVar57 + lVar54);
      *pSVar48 = auVar59._0_8_;
    }
    lVar57 = lVar57 + 3;
  }
  lVar56 = 2;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_1140);
  lVar54 = 0;
  for (lVar57 = 0; lVar57 != 4; lVar57 = lVar57 + 1) {
    pSVar47 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>,_1> *)&local_fc0,
                         lVar54);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)local_ef0,
               &this->m_element->m_strainANS_D,lVar57);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_dc0,pSVar47,(StorageBaseType *)local_ef0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1140,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_dc0);
    lVar54 = lVar54 + 2;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_1140);
  uVar55 = 0;
  while (bVar58 = lVar56 != 0, lVar56 = lVar56 + -1, bVar58) {
    pSVar49 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)local_12e0,0,
                         uVar55 | 2);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)local_ef0,
               &this->m_element->m_strainANS_D,uVar55 | 6);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_dc0,pSVar49,(StorageBaseType *)local_ef0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1140,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_dc0);
    uVar55 = uVar55 + 1;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_24,_1,_1,_24>_> *)&local_1140);
  lVar56 = 2;
  uVar55 = 0;
  while (bVar58 = lVar56 != 0, lVar56 = lVar56 + -1, bVar58) {
    pSVar49 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> *)local_12e0,0,
                         uVar55);
    Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>::Block
              ((Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true> *)local_ef0,
               &this->m_element->m_strainANS_D,uVar55 | 4);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>
                      *)local_dc0,pSVar49,(StorageBaseType *)local_ef0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,24,1,1,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,1,24,1,1,24>> *)&local_1140,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_24,_1,_1,_24>_>,_const_Eigen::Block<Eigen::Matrix<double,_8,_24,_1,_8,_24>,_1,_24,_true>_>_>
                *)local_dc0);
    uVar55 = uVar55 + 1;
  }
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true,_true> *)
                  local_dc0,&local_940,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,24,1,6,24>,1,24,true>,Eigen::Matrix<double,1,24,1,1,24>>
            ((Block<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1,_24,_true> *)local_dc0,&local_1140);
  for (lVar56 = 0; lVar56 != 0x18; lVar56 = lVar56 + 1) {
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar175._8_8_ = 0;
    auVar175._0_8_ = dVar75 * dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar75;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar72 * dVar72 * *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar89,auVar175,auVar6);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auVar59._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar72;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = dVar75 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar90,auVar133,auVar7);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar91._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar59._0_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auVar91._0_8_ * *pSVar50;
    auVar59 = vfmadd213sd_fma(auVar134,auVar91,auVar8);
    auVar135._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar135._8_8_ = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar91._0_8_;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar75 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar92,auVar135,auVar9);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,5,
                         lVar56);
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auVar59._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar91._0_8_;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar72 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar93,auVar136,auVar10);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,0,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar176._8_8_ = 0;
    auVar176._0_8_ = dVar217 * dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar217;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar74 * dVar74 * *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar94,auVar176,auVar11);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auVar59._0_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar74;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar217 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar95,auVar137,auVar12);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar96._8_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar59._0_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auVar96._0_8_ * *pSVar50;
    auVar59 = vfmadd213sd_fma(auVar138,auVar96,auVar13);
    auVar139._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar139._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar96._0_8_;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar217 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar97,auVar139,auVar14);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,5,
                         lVar56);
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auVar59._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar96._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar74 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar98,auVar140,auVar15);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,1,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar141._8_8_ = 0;
    auVar141._0_8_ = (dVar1 + dVar1) * dVar75;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar217;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = (*pSVar50 + *pSVar50) * dVar72 * dVar74;
    auVar59 = vfmadd231sd_fma(auVar99,auVar141,auVar16);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = auVar65._0_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auVar59._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar142,auVar100,auVar17);
    auVar143._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar143._8_8_ = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar96._0_8_;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = (*pSVar50 + *pSVar50) * auVar91._0_8_;
    auVar59 = vfmadd132sd_fma(auVar101,auVar143,auVar18);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auVar66._0_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auVar59._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar144,auVar102,auVar19);
    auVar145._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,5,
                         lVar56);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_12e8;
    auVar145._8_8_ = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar145,auVar103,auVar20);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,2,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar177._8_8_ = 0;
    auVar177._0_8_ = dVar71 * dVar1;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar71;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar73 * dVar73 * *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar104,auVar177,auVar21);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar146._8_8_ = 0;
    auVar146._0_8_ = auVar59._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar73;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar71 * *pSVar50;
    auVar59 = vfmadd132sd_fma(auVar105,auVar146,auVar22);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar106._8_8_ = 0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar59._0_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = auVar106._0_8_ * *pSVar50;
    auVar59 = vfmadd213sd_fma(auVar147,auVar106,auVar23);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = auVar106._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar59._0_8_;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar71 * *pSVar50;
    auVar59 = vfmadd213sd_fma(auVar107,auVar148,auVar24);
    auVar178._8_8_ = 0;
    auVar178._0_8_ =
         dVar73 * local_940.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage
                  .m_data.array[5];
    auVar59 = vfmadd213sd_fma(auVar178,auVar148,auVar59);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,3,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = (dVar1 + dVar1) * dVar75;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar71;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = (*pSVar50 + *pSVar50) * dVar72 * dVar73;
    auVar59 = vfmadd231sd_fma(auVar108,auVar149,auVar25);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar109._8_8_ = 0;
    auVar109._0_8_ = local_12f0;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = auVar59._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar150,auVar109,auVar26);
    auVar151._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar151._8_8_ = 0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar106._0_8_;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = (*pSVar50 + *pSVar50) * auVar91._0_8_;
    auVar59 = vfmadd132sd_fma(auVar110,auVar151,auVar27);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar111._8_8_ = 0;
    auVar111._0_8_ = local_12f8;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = auVar59._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar152,auVar111,auVar28);
    auVar153._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,5,
                         lVar56);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = local_1300;
    auVar153._8_8_ = 0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar153,auVar112,auVar29);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,4,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,0,
                         lVar56);
    dVar1 = *pSVar50;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,1,
                         lVar56);
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (dVar1 + dVar1) * dVar217;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar71;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = (*pSVar50 + *pSVar50) * dVar74 * dVar73;
    auVar59 = vfmadd231sd_fma(auVar113,auVar154,auVar30);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,2,
                         lVar56);
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_1308;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = auVar59._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar155,auVar114,auVar31);
    auVar156._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,3,
                         lVar56);
    auVar156._8_8_ = 0;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auVar106._0_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = (*pSVar50 + *pSVar50) * auVar96._0_8_;
    auVar59 = vfmadd132sd_fma(auVar115,auVar156,auVar32);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,4,
                         lVar56);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_1310;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = auVar59._0_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar157,auVar116,auVar33);
    auVar158._0_8_ = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)&local_940,5,
                         lVar56);
    auVar117._8_8_ = 0;
    auVar117._0_8_ = local_1318;
    auVar158._8_8_ = 0;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *pSVar50;
    auVar59 = vfmadd231sd_fma(auVar158,auVar117,auVar34);
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,5,
                         lVar56);
    *pSVar50 = auVar59._0_8_;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_12c0,
             (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_f80);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_1350);
  lVar56 = 0;
  while (lVar56 != 0x18) {
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,0,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = *pSVar51;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = SVar4;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_1350;
    auVar59 = vfmadd213sd_fma(auVar118,auVar159,auVar35);
    local_1350 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,1,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar119._8_8_ = 0;
    auVar119._0_8_ = *pSVar51;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = SVar4;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_1348;
    auVar59 = vfmadd213sd_fma(auVar119,auVar160,auVar36);
    local_1348 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,2,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = *pSVar51;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = SVar4;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_1340;
    auVar59 = vfmadd213sd_fma(auVar120,auVar161,auVar37);
    local_1340 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,3,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar121._8_8_ = 0;
    auVar121._0_8_ = *pSVar51;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = SVar4;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_1338;
    auVar59 = vfmadd213sd_fma(auVar121,auVar162,auVar38);
    local_1338 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,4,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = *pSVar51;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = SVar4;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_1330;
    auVar59 = vfmadd213sd_fma(auVar122,auVar163,auVar39);
    local_1330 = auVar59._0_8_;
    pSVar50 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0,5,
                         lVar56);
    SVar4 = *pSVar50;
    pSVar51 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_1> *)
                         &this->m_element->m_d_dt,lVar56);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = *pSVar51;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = SVar4;
    lVar56 = lVar56 + 1;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_1328;
    auVar59 = vfmadd213sd_fma(auVar123,auVar164,auVar40);
    local_1328 = auVar59._0_8_;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)local_ef0,(MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_1350,
             &this->m_element->m_Alpha);
  Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_12c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
              *)local_ef0);
  std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)local_ef0
             ,&(this->m_element->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_material.
               super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>);
  pdVar52 = ((local_ef0[0].m_lhs.m_lhs.m_lhs.m_matrix)->
            super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>).m_storage.m_data.array +
            4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_ef0[0].m_lhs.m_lhs.m_rhs);
  local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)(local_1358 * this->m_element->m_GaussScaling);
  local_440._0_8_ = (DenseCoeffsBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>,_1> *)local_dc0;
  local_440._8_8_ = pdVar52;
  local_440._16_8_ = (MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_12c0;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,1,0,6,1>,0>>
  ::operator*(local_ef0,
              (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,1,0,6,1>,0>>
               *)local_440,(double *)&local_11a8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,1,0,6,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,1,0,24,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,24,1,0,24,1>> *)&local_240,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_1,_0,_24,_1>_>_>_>
              *)local_ef0);
  local_440._0_8_ = &local_330;
  local_440._8_8_ = pdVar52;
  Eigen::PlainObjectBase<Eigen::Matrix<double,5,6,1,5,6>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,5,6,1,5,6>> *)local_ef0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>_>
              *)local_440);
  local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_0>.m_rows.
  m_value = (long)&local_12c0;
  local_1290._0_8_ = local_1358 * this->m_element->m_GaussScaling;
  local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)local_ef0;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
             *)local_440,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
             *)&local_11a8,(double *)local_1290);
  Eigen::PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,1,0,5,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>> *)&local_1068,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>_>
              *)local_440);
  local_1290._8_8_ = &local_330;
  local_1280._96_8_ = local_1358 * this->m_element->m_GaussScaling;
  local_1290._0_8_ = local_ef0;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
             *)&local_11a8,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,5,1,6,5>,0>>
             *)local_1290,(double *)(local_1280 + 0x60));
  Eigen::PlainObjectBase<Eigen::Matrix<double,5,5,1,5,5>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,5,1,6,5>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,5,0,5,5>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,5,5,1,5,5>> *)local_440,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>_>
              *)&local_11a8);
  vector = local_1320;
  Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
            (&local_11a8,local_1320,0,0x18);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,54,1,0,54,1>,_1,1,false>,Eigen::Matrix<double,24,1,0,24,1>>
            (&local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,
             &local_240);
  Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
            (&local_11a8,vector,0x18,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,54,1,0,54,1>,_1,1,false>,Eigen::Matrix<double,5,1,0,5,1>>
            (&local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,
             &local_1068);
  local_1290._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
        *)local_440;
  Eigen::VectorBlock<Eigen::Matrix<double,_54,_1,_0,_54,_1>,_-1>::VectorBlock
            (&local_11a8,vector,0x1d,0x19);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,54,1,0,54,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,25,1,0,25,1>,0,Eigen::Stride<0,0>>>
            (&local_11a8.super_Block<Eigen::Matrix<double,_54,_1,_0,_54,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_25,_1,_0,_25,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1290);
  return;
}

Assistant:

void ShellANCF_Force::Evaluate(ChVectorN<double, 54>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * (*m_alpha_eas);

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    // For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: the input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Internal force calculation
    ChVectorN<double, 24> Fint = (strainD.transpose() * E_eps * strain) * (detJ0 * m_element->m_GaussScaling);

    // EAS terms
    ChMatrixNM<double, 5, 6> temp56 = G.transpose() * E_eps;
    ChVectorN<double, 5> HE = (temp56 * strain) * (detJ0 * m_element->m_GaussScaling);     // EAS residual
    ChMatrixNM<double, 5, 5> KALPHA = (temp56 * G) * (detJ0 * m_element->m_GaussScaling);  // EAS Jacobian

    /// Total result vector
    result.segment(0, 24) = Fint;
    result.segment(24, 5) = HE;
    result.segment(29, 5 * 5) = Eigen::Map<ChVectorN<double, 5 * 5>>(KALPHA.data(), 5 * 5);
}